

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand_lib.c
# Opt level: O0

int rand_set_rand_method_internal(RAND_METHOD *meth,ENGINE *e)

{
  ENGINE *pEVar1;
  int iVar2;
  ENGINE *in_RSI;
  RAND_METHOD *in_RDI;
  int local_4;
  
  iVar2 = CRYPTO_THREAD_run_once((CRYPTO_ONCE *)in_RSI,(_func_void *)0x2b4090);
  if ((iVar2 == 0) || (do_rand_init_ossl_ret_ == 0)) {
    local_4 = 0;
  }
  else {
    iVar2 = CRYPTO_THREAD_write_lock(in_RSI);
    if (iVar2 == 0) {
      local_4 = 0;
    }
    else {
      pEVar1 = in_RSI;
      ENGINE_finish((ENGINE *)funct_ref);
      funct_ref = pEVar1;
      default_RAND_meth = in_RDI;
      CRYPTO_THREAD_unlock(funct_ref);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int rand_set_rand_method_internal(const RAND_METHOD *meth,
                                         ossl_unused ENGINE *e)
{
    if (!RUN_ONCE(&rand_init, do_rand_init))
        return 0;

    if (!CRYPTO_THREAD_write_lock(rand_meth_lock))
        return 0;
#  ifndef OPENSSL_NO_ENGINE
    ENGINE_finish(funct_ref);
    funct_ref = e;
#  endif
    default_RAND_meth = meth;
    CRYPTO_THREAD_unlock(rand_meth_lock);
    return 1;
}